

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

char * cards_print(Card **cards,uchar cardsCount,_Bool showDownCards)

{
  uchar uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (cardsPrintBufIndex == 0xff) {
    cardsPrintBufIndex = '\0';
  }
  uVar1 = cardsPrintBufIndex;
  lVar3 = (ulong)cardsPrintBufIndex * 0x100 - (ulong)cardsPrintBufIndex;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xbf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 199) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xcf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xd7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xdf) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xe7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xef) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xf7) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x80) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x88) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x90) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x98) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xa0) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xa8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xb0) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0xb8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x40) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x48) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x50) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x58) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x60) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x68) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x70) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x78) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 8) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x10) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x18) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x20) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x28) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x30) = 0;
  *(undefined8 *)((long)cardsPrintBufs + lVar3 + 0x38) = 0;
  if (cardsCount != '\0') {
    uVar4 = 0;
    do {
      uVar1 = cardsPrintBufIndex;
      uVar6 = (ulong)cardsPrintBufIndex;
      if (uVar4 != 0) {
        pcVar5 = (char *)((long)cardsPrintBufs + ((ulong)cardsPrintBufIndex * 0x100 - uVar6));
        sVar2 = strlen(pcVar5);
        pcVar5 = pcVar5 + sVar2;
        pcVar5[0] = ' ';
        pcVar5[1] = '\0';
      }
      pcVar5 = card_print(cards[uVar4],showDownCards);
      strcat((char *)((long)cardsPrintBufs + ((ulong)uVar1 * 0x100 - uVar6)),pcVar5);
      uVar4 = uVar4 + 1;
      uVar1 = cardsPrintBufIndex;
    } while (cardsCount != uVar4);
  }
  cardsPrintBufIndex = uVar1 + 1;
  return (char *)((long)cardPrintBufs +
                 ((ulong)cardsPrintBufIndex * 0x100 - (ulong)cardsPrintBufIndex) + 0x401);
}

Assistant:

char * cards_print(Card ** cards, unsigned char cardsCount, bool showDownCards)
{
	unsigned char i;
	if(cardsPrintBufIndex>=255)
		cardsPrintBufIndex = 0;

	memset(cardsPrintBufs[cardsPrintBufIndex], 0, 255);

	for(i=0;i<cardsCount;i++)
	{
		if(i>0)
			strcat(cardsPrintBufs[cardsPrintBufIndex], " ");

		strcat(cardsPrintBufs[cardsPrintBufIndex], card_print(cards[i], showDownCards));
	}

	cardsPrintBufIndex++;
	return cardsPrintBufs[(cardsPrintBufIndex-1)];
}